

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O1

void TCLAP::ExtractValue<char>(char *destVal,string *strVal,ValueLike *vl)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  ArgParseException *pAVar3;
  long *plVar4;
  size_type *psVar5;
  uint uVar6;
  bool bVar7;
  istringstream is;
  string local_208;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  long local_1a8 [4];
  byte abStack_188 [88];
  ios_base local_130 [264];
  
  std::__cxx11::string::string
            ((string *)&local_208,(strVal->_M_dataplus)._M_p,(allocator *)&local_1c8);
  std::__cxx11::istringstream::istringstream((istringstream *)local_1a8,(string *)&local_208,_S_in);
  paVar1 = &local_208.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  uVar6 = 0;
  bVar7 = false;
  if (*(int *)(abStack_188 + *(long *)(local_1a8[0] + -0x18)) == 0) {
    do {
      iVar2 = std::istream::peek();
      if (iVar2 == -1) break;
      std::operator>>((istream *)local_1a8,destVal);
      uVar6 = uVar6 + 1;
    } while (*(int *)(abStack_188 + *(long *)(local_1a8[0] + -0x18)) == 0);
    bVar7 = 1 < uVar6;
  }
  if ((abStack_188[*(long *)(local_1a8[0] + -0x18)] & 5) != 0) {
    pAVar3 = (ArgParseException *)__cxa_allocate_exception(0x68);
    std::operator+(&local_1c8,"Couldn\'t read argument value from string \'",strVal);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_1c8);
    local_208._M_dataplus._M_p = (pointer)*plVar4;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_208._M_dataplus._M_p == psVar5) {
      local_208.field_2._M_allocated_capacity = *psVar5;
      local_208.field_2._8_4_ = (undefined4)plVar4[3];
      local_208.field_2._12_4_ = *(undefined4 *)((long)plVar4 + 0x1c);
      local_208._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_208.field_2._M_allocated_capacity = *psVar5;
    }
    local_208._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"undefined","");
    ArgParseException::ArgParseException(pAVar3,&local_208,&local_1e8);
    __cxa_throw(pAVar3,&ArgParseException::typeinfo,ArgException::~ArgException);
  }
  if (!bVar7) {
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1a8);
    std::ios_base::~ios_base(local_130);
    return;
  }
  pAVar3 = (ArgParseException *)__cxa_allocate_exception(0x68);
  std::operator+(&local_1c8,"More than one valid value parsed from string \'",strVal);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  local_208._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_208._M_dataplus._M_p == psVar5) {
    local_208.field_2._M_allocated_capacity = *psVar5;
    local_208.field_2._8_4_ = (undefined4)plVar4[3];
    local_208.field_2._12_4_ = *(undefined4 *)((long)plVar4 + 0x1c);
    local_208._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_208.field_2._M_allocated_capacity = *psVar5;
  }
  local_208._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"undefined","");
  ArgParseException::ArgParseException(pAVar3,&local_208,&local_1e8);
  __cxa_throw(pAVar3,&ArgParseException::typeinfo,ArgException::~ArgException);
}

Assistant:

void
ExtractValue(T &destVal, const std::string& strVal, ValueLike vl)
{
    static_cast<void>(vl); // Avoid warning about unused vl
    istringstream is(strVal.c_str());

    int valuesRead = 0;
    while ( is.good() ) {
	if ( is.peek() != EOF )
#ifdef TCLAP_SETBASE_ZERO
	    is >> std::setbase(0) >> destVal;
#else
	    is >> destVal;
#endif
	else
	    break;

	valuesRead++;
    }

    if ( is.fail() )
	throw( ArgParseException("Couldn't read argument value "
				 "from string '" + strVal + "'"));


    if ( valuesRead > 1 )
	throw( ArgParseException("More than one valid value parsed from "
				 "string '" + strVal + "'"));

}